

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

QPolygon * __thiscall
QGraphicsView::mapFromScene(QPolygon *__return_storage_ptr__,QGraphicsView *this,QRectF *rect)

{
  QTransform *pQVar1;
  QGraphicsViewPrivate *this_00;
  double dVar2;
  qint64 qVar3;
  QPoint QVar4;
  pointer pQVar5;
  long in_FS_OFFSET;
  double in_XMM1_Qa;
  QPointF QVar6;
  QPointF QVar7;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_98;
  QPointF local_78;
  QPointF local_68;
  QPointF local_58;
  QPointF local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  local_48 = (QPointF)ZEXT816(0);
  local_58.xp = 0.0;
  local_58.yp = 0.0;
  local_68.xp = 0.0;
  local_68.yp = 0.0;
  local_78.xp = 0.0;
  local_78.yp = 0.0;
  if ((this_00->field_0x300 & 0x10) == 0) {
    pQVar1 = &this_00->matrix;
    local_98 = (double)QTransform::map((QPointF *)pQVar1);
    local_48.yp = in_XMM1_Qa;
    local_48.xp = local_98;
    local_b8 = rect->yp;
    local_c0 = (double)QTransform::map((QPointF *)pQVar1);
    QVar6 = QRectF::bottomRight(rect);
    local_d0 = QVar6.yp;
    local_d8 = (double)QTransform::map((QPointF *)pQVar1);
    local_e0 = rect->yp + rect->h;
    local_e8 = (double)QTransform::map((QPointF *)pQVar1);
    local_c8 = in_XMM1_Qa;
  }
  else {
    QVar6.xp = rect->xp;
    QVar6.yp = rect->yp;
    local_c0 = rect->w + QVar6.xp;
    local_58.xp = local_c0;
    local_58.yp = QVar6.yp;
    local_48 = QVar6;
    QVar7 = QRectF::bottomRight(rect);
    local_d0 = QVar7.yp;
    local_d8 = QVar7.xp;
    local_e8 = rect->xp;
    local_e0 = rect->yp + rect->h;
    local_c8 = QVar6.yp;
    local_98 = QVar6.xp;
    local_b8 = QVar6.yp;
  }
  qVar3 = QGraphicsViewPrivate::horizontalScroll(this_00);
  dVar2 = (double)qVar3;
  qVar3 = QGraphicsViewPrivate::verticalScroll(this_00);
  local_78.yp = (qreal)qVar3;
  local_48.yp = local_c8 - local_78.yp;
  local_48.xp = local_98 - dVar2;
  local_58.xp = local_c0 - dVar2;
  local_58.yp = local_b8 - local_78.yp;
  local_68.xp = local_d8 - dVar2;
  local_68.yp = local_d0 - local_78.yp;
  local_78.xp = local_e8 - dVar2;
  local_78.yp = local_e0 - local_78.yp;
  (__return_storage_ptr__->super_QList<QPoint>).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->super_QList<QPoint>).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->super_QList<QPoint>).d.ptr = (QPoint *)&DAT_aaaaaaaaaaaaaaaa;
  QList<QPoint>::QList(&__return_storage_ptr__->super_QList<QPoint>,4);
  QVar4 = QPointF::toPoint(&local_48);
  pQVar5 = QList<QPoint>::data(&__return_storage_ptr__->super_QList<QPoint>);
  *pQVar5 = QVar4;
  QVar4 = QPointF::toPoint(&local_58);
  pQVar5 = QList<QPoint>::data(&__return_storage_ptr__->super_QList<QPoint>);
  pQVar5[1] = QVar4;
  QVar4 = QPointF::toPoint(&local_68);
  pQVar5 = QList<QPoint>::data(&__return_storage_ptr__->super_QList<QPoint>);
  pQVar5[2] = QVar4;
  QVar4 = QPointF::toPoint(&local_78);
  pQVar5 = QList<QPoint>::data(&__return_storage_ptr__->super_QList<QPoint>);
  pQVar5[3] = QVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QPolygon QGraphicsView::mapFromScene(const QRectF &rect) const
{
    Q_D(const QGraphicsView);
    QPointF tl;
    QPointF tr;
    QPointF br;
    QPointF bl;
    if (!d->identityMatrix) {
        const QTransform &x = d->matrix;
        tl = x.map(rect.topLeft());
        tr = x.map(rect.topRight());
        br = x.map(rect.bottomRight());
        bl = x.map(rect.bottomLeft());
    } else {
        tl = rect.topLeft();
        tr = rect.topRight();
        br = rect.bottomRight();
        bl = rect.bottomLeft();
    }
    QPointF scrollOffset(d->horizontalScroll(), d->verticalScroll());
    tl -= scrollOffset;
    tr -= scrollOffset;
    br -= scrollOffset;
    bl -= scrollOffset;

    QPolygon poly(4);
    poly[0] = tl.toPoint();
    poly[1] = tr.toPoint();
    poly[2] = br.toPoint();
    poly[3] = bl.toPoint();
    return poly;
}